

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::FiberPool::Impl::disposeImpl(Impl *this,void *pointer)

{
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> *pMVar1;
  iterator *piVar2;
  long *plVar3;
  FiberStack *pFVar4;
  _Elt_pointer ppFVar5;
  _Map_pointer pppFVar6;
  long *plVar7;
  bool bVar8;
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
  aVar9;
  long lVar10;
  bool bVar11;
  Locked<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_> lock;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>
  _kjDefer663;
  FiberStack *local_48;
  Mutex *local_40;
  deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_> *local_38;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>
  local_30;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_30.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
        )&local_48;
  local_30.maybeFunc.ptr.isSet = true;
  local_48 = (FiberStack *)pointer;
  aVar9 = (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:663:5)>_2
           )&local_48;
  if (*(int *)((long)pointer + 8) != 0) goto LAB_00418866;
  lookupCoreLocalFreelist((Impl *)&stack0xffffffffffffffe0);
  plVar7 = (long *)CONCAT71(uStack_1f,local_20);
  if (plVar7 == (long *)0x0) {
LAB_004187a1:
    bVar8 = false;
  }
  else {
    LOCK();
    pFVar4 = (FiberStack *)*plVar7;
    *plVar7 = (long)local_48;
    UNLOCK();
    bVar8 = true;
    local_48 = pFVar4;
    if (pFVar4 == (FiberStack *)0x0) {
      bVar11 = false;
    }
    else {
      lVar10 = 0;
      do {
        bVar11 = lVar10 == 8;
        if (bVar11) {
          bVar8 = false;
          break;
        }
        LOCK();
        plVar3 = (long *)((long)plVar7 + lVar10 + 8);
        pFVar4 = (FiberStack *)*plVar3;
        *plVar3 = (long)local_48;
        UNLOCK();
        lVar10 = lVar10 + 8;
        local_48 = pFVar4;
      } while (pFVar4 != (FiberStack *)0x0);
    }
    if (bVar11) goto LAB_004187a1;
  }
  aVar9 = local_30.maybeFunc.ptr.field_1;
  if (!bVar8) {
    pMVar1 = &this->freelist;
    local_20 = 0;
    kj::_::Mutex::lock(&pMVar1->mutex,0);
    local_38 = &(this->freelist).value;
    ppFVar5 = (this->freelist).value.
              super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    local_40 = &pMVar1->mutex;
    if (ppFVar5 ==
        (this->freelist).value.
        super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<kj::_::FiberStack*,std::allocator<kj::_::FiberStack*>>::
      _M_push_back_aux<kj::_::FiberStack*const&>
                ((deque<kj::_::FiberStack*,std::allocator<kj::_::FiberStack*>> *)local_38,&local_48)
      ;
    }
    else {
      *ppFVar5 = local_48;
      piVar2 = &(this->freelist).value.
                super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>._M_impl
                .super__Deque_impl_data._M_finish;
      piVar2->_M_cur = piVar2->_M_cur + 1;
    }
    pppFVar6 = (local_38->
               super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>)._M_impl
               .super__Deque_impl_data._M_finish._M_node;
    ppFVar5 = (local_38->
              super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>)._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    if (this->maxFreelist <
        ((long)(local_38->
               super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>)._M_impl
               .super__Deque_impl_data._M_start._M_last - (long)ppFVar5 >> 3) +
        ((long)(local_38->
               super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>)._M_impl
               .super__Deque_impl_data._M_finish._M_cur -
         (long)(local_38->
               super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>)._M_impl
               .super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)pppFVar6 -
                  (long)(local_38->
                        super__Deque_base<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(pppFVar6 == (_Map_pointer)0x0)) * 0x40) {
      local_48 = *ppFVar5;
      std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>::pop_front(local_38);
    }
    else {
      local_48 = (FiberStack *)0x0;
    }
    aVar9 = local_30.maybeFunc.ptr.field_1;
    if (local_40 != (Mutex *)0x0) {
      kj::_::Mutex::unlock(local_40,EXCLUSIVE,(Waiter *)0x0);
      aVar9 = local_30.maybeFunc.ptr.field_1;
    }
  }
LAB_00418866:
  local_30.maybeFunc.ptr.field_1 = aVar9;
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:663:5)>
  ::run(&local_30);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    _::FiberStack* stack = reinterpret_cast<_::FiberStack*>(pointer);
    KJ_DEFER(delete stack);

    // Verify that the stack was reset before returning, otherwise it might be in a weird state
    // where we don't want to reuse it.
    if (stack->isReset()) {
#if USE_CORE_LOCAL_FREELISTS
      KJ_IF_SOME(core, lookupCoreLocalFreelist()) {
        for (auto& stackPtr: core.stacks) {
          stack = __atomic_exchange_n(&stackPtr, stack, __ATOMIC_RELEASE);
          if (stack == nullptr) {
            // Cool, we inserted the stack into an unused slot. We're done.
            return;
          }
        }
        // All slots were occupied, so we inserted the new stack in the front, pushed the rest back,
        // and now `stack` refers to the stack that fell off the end of the core-local list. That
        // needs to go into the global freelist.
      }
#endif

      auto lock = freelist.lockExclusive();
      lock->push_back(stack);
      if (lock->size() > maxFreelist) {
        stack = lock->front();
        lock->pop_front();
      } else {
        stack = nullptr;
      }
    }
  }